

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

Aig_Obj_t * Dar_RefactBuildGraph(Aig_Man_t *pAig,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph)

{
  uint uVar1;
  Kit_Node_t *pKVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  
  if (pGraph->fConst == 0) {
    lVar6 = 0;
    lVar8 = 0;
    puVar9 = (undefined1 *)0x0;
    while( true ) {
      lVar7 = (long)pGraph->nLeaves;
      if (lVar7 <= lVar8) break;
      pKVar2 = pGraph->pNodes;
      puVar9 = &(pKVar2->eEdge0).field_0x0 + lVar6;
      pvVar4 = Vec_PtrEntry(vCut,(int)lVar8);
      *(void **)((long)&pKVar2->field_2 + lVar6) = pvVar4;
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x18;
    }
    uVar5 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar5 < (uint)pGraph->nLeaves) {
      pAVar3 = (Aig_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pGraph->pNodes[uVar5].field_2.pFunc);
    }
    else {
      lVar6 = lVar7 * 0x18;
      for (; lVar7 < pGraph->nSize; lVar7 = lVar7 + 1) {
        pKVar2 = pGraph->pNodes;
        puVar9 = &(pKVar2->eEdge0).field_0x0 + lVar6;
        uVar5 = *(uint *)(&(pKVar2->eEdge0).field_0x0 + lVar6);
        uVar1 = *(uint *)(&(pKVar2->eEdge1).field_0x0 + lVar6);
        pAVar3 = Aig_And(pAig,(Aig_Obj_t *)
                              ((ulong)(uVar5 & 1) ^
                              (ulong)pKVar2[uVar5 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Aig_Obj_t *)
                         ((ulong)(uVar1 & 1) ^ (ulong)pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Aig_Obj_t **)((long)&pKVar2->field_2 + lVar6) = pAVar3;
        lVar6 = lVar6 + 0x18;
      }
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ *(ulong *)(puVar9 + 8));
    }
  }
  else {
    pAVar3 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pAig->pConst1);
  }
  return pAVar3;
}

Assistant:

Aig_Obj_t * Dar_RefactBuildGraph( Aig_Man_t * pAig, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph )
{
    Aig_Obj_t * pAnd0, * pAnd1;
    Kit_Node_t * pNode = NULL;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Aig_NotCond( Aig_ManConst1(pAig), Kit_GraphIsComplement(pGraph) );
    // set the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Vec_PtrEntry(vCut, i);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Aig_NotCond( (Aig_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
//printf( "Building (current number %d):\n", Aig_ManObjNumMax(pAig) );
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Aig_And( pAig, pAnd0, pAnd1 );
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    // complement the result if necessary
    return Aig_NotCond( (Aig_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}